

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm2wav.cpp
# Opt level: O0

void dump_info(PlayerBase *player)

{
  INT32 *this;
  byte bVar1;
  UINT8 UVar2;
  uint uVar3;
  UINT32 UVar4;
  UINT32 UVar5;
  FILE *pFVar6;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar8;
  size_type sVar9;
  reference pvVar10;
  char local_61 [5];
  undefined1 auStack_5c [3];
  char str [5];
  UINT32 i;
  DEV_DEF **devDefList;
  PLR_SONG_INFO songInfo;
  vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> devInfList;
  PlayerBase *player_local;
  
  std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::vector
            ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)&songInfo.volGain);
  pFVar6 = _stderr;
  iVar7 = (*player->_vptr_PlayerBase[3])();
  fprintf(pFVar6,"PlayerName: %s\n",CONCAT44(extraout_var,iVar7));
  (*player->_vptr_PlayerBase[8])(player,&devDefList);
  (*player->_vptr_PlayerBase[9])(player,&songInfo.volGain);
  FCC2STR(local_61,(UINT32)devDefList);
  fprintf(_stderr,"SongInfo: %s v%X.%X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",local_61,
          (ulong)devDefList._4_2_,(ulong)devDefList._6_2_,(ulong)songInfo.format,songInfo._4_4_,
          songInfo.tickRateMul,songInfo.tickRateDiv,songInfo.loopTick);
  _auStack_5c = 0;
  while( true ) {
    uVar8 = (ulong)_auStack_5c;
    sVar9 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::size
                      ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)&songInfo.volGain);
    if (sVar9 <= uVar8) break;
    pvVar10 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::operator[]
                        ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)&songInfo.volGain,
                         (ulong)_auStack_5c);
    FCC2STR(local_61,pvVar10->core);
    pFVar6 = _stderr;
    this = &songInfo.volGain;
    pvVar10 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::operator[]
                        ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)this,
                         (ulong)_auStack_5c);
    uVar3 = pvVar10->id;
    pvVar10 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::operator[]
                        ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)this,
                         (ulong)_auStack_5c);
    bVar1 = pvVar10->type;
    pvVar10 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::operator[]
                        ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)this,
                         (ulong)_auStack_5c);
    UVar2 = pvVar10->instance;
    pvVar10 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::operator[]
                        ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)this,
                         (ulong)_auStack_5c);
    UVar4 = pvVar10->devCfg->clock;
    pvVar10 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::operator[]
                        ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)this,
                         (ulong)_auStack_5c);
    UVar5 = pvVar10->smplRate;
    pvVar10 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::operator[]
                        ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)this,
                         (ulong)_auStack_5c);
    fprintf(pFVar6,"  Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
            (ulong)uVar3,(ulong)bVar1,(ulong)(uint)(int)(char)UVar2,local_61,UVar4,UVar5,
            (uint)pvVar10->volume);
    pvVar10 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::operator[]
                        ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)this,
                         (ulong)_auStack_5c);
    register0x00000000 = SndEmu_GetDevDefList(pvVar10->type);
    fprintf(_stderr,"    Cores:");
    for (; *stack0xffffffffffffffa8 != (DEV_DEF *)0x0;
        register0x00000000 = stack0xffffffffffffffa8 + 1) {
      FCC2STR(local_61,(*stack0xffffffffffffffa8)->coreID);
      fprintf(_stderr," %s",local_61);
    }
    fprintf(_stderr,"\n");
    _auStack_5c = _auStack_5c + 1;
  }
  fprintf(_stderr,"\n");
  std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::~vector
            ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)&songInfo.volGain);
  return;
}

Assistant:

static void dump_info(PlayerBase *player) {
    std::vector<PLR_DEV_INFO> devInfList;
    PLR_SONG_INFO songInfo;
    const DEV_DEF **devDefList;
    UINT32 i;
    char str[5];

    fprintf(stderr,"PlayerName: %s\n",player->GetPlayerName());
    player->GetSongInfo(songInfo);
    player->GetSongDeviceInfo(devInfList);

    FCC2STR(str,songInfo.format);
    fprintf(stderr,"SongInfo: %s v%X.%X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",
      str,
      songInfo.fileVerMaj,
      songInfo.fileVerMin,
      songInfo.tickRateMul,
      songInfo.tickRateDiv,
      songInfo.songLen,
      songInfo.loopTick,
      songInfo.deviceCnt);

    for(i=0;i<devInfList.size();i++) {
        FCC2STR(str,devInfList[i].core);
        fprintf(stderr,"  Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
          devInfList[i].id,
          devInfList[i].type,
          (INT8)devInfList[i].instance,
          str,
          devInfList[i].devCfg->clock,
          devInfList[i].smplRate,
          devInfList[i].volume);
        devDefList = SndEmu_GetDevDefList(devInfList[i].type);
        fprintf(stderr,"    Cores:");
        while(*devDefList) {
            FCC2STR(str,(*devDefList)->coreID);
            fprintf(stderr," %s",str);
            devDefList++;
        }
        fprintf(stderr,"\n");

    }
    fprintf(stderr,"\n");
}